

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_expression_move.hpp
# Opt level: O3

bool __thiscall
optimization::global_expr_move::BlockOps::disable_op
          (BlockOps *this,
          variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
          *op)

{
  variant_alternative_t<1UL,_variant<Op,_pair<pair<VarId,_Value>,_VarId>_>_> *pvVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  _Base_ptr p_Var5;
  bool bVar6;
  anon_class_8_1_a78179b7_conflict local_60;
  undefined **local_58;
  uint local_50;
  _Copy_ctor_base<false,_int,_mir::inst::VarId> local_40;
  
  if ((op->
      super__Variant_base<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
      ).
      super__Move_assign_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
      .
      super__Copy_assign_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
      .
      super__Move_ctor_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
      .
      super__Copy_ctor_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
      .
      super__Variant_storage_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
      ._M_index == '\0') {
    return false;
  }
  pvVar1 = std::
           get<1ul,optimization::global_expr_move::Op,std::pair<std::pair<mir::inst::VarId,mir::inst::Value>,mir::inst::VarId>>
                     (op);
  local_60.__lhs = &local_40;
  local_58 = &PTR_display_001eb100;
  local_50 = (pvVar1->first).first.id;
  local_40.super__Variant_storage_alias<int,_mir::inst::VarId>._M_index =
       (pvVar1->first).second.field_0x18;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
    ::_S_vtable._M_arr
    [(long)(char)local_40.super__Variant_storage_alias<int,_mir::inst::VarId>._M_index + 1]._M_data)
            (&local_60,(variant<int,_mir::inst::VarId> *)&(pvVar1->first).second.field_0x8);
  p_Var2 = (this->stores)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &(this->stores)._M_t._M_impl.super__Rb_tree_header;
  p_Var3 = &p_Var4->_M_header;
  p_Var5 = &p_Var4->_M_header;
  if (p_Var2 != (_Base_ptr)0x0) {
    do {
      bVar6 = *(uint *)&p_Var2[1]._M_parent < local_50;
      if (!bVar6) {
        p_Var3 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[bVar6];
    } while (p_Var2 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var3 != p_Var4) &&
       (p_Var5 = p_Var3, local_50 < *(uint *)&p_Var3[1]._M_parent)) {
      p_Var5 = &p_Var4->_M_header;
    }
  }
  return (_Rb_tree_header *)p_Var5 != p_Var4;
}

Assistant:

bool disable_op(std::variant<Op, LoadOp> op) {
    if (op.index() == 0) {
      return false;
    } else {
      auto load = std::get<LoadOp>(op);
      return stores.count(load.first.first);
    }
  }